

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

bool __thiscall QSslSocket::waitForEncrypted(QSslSocket *this,int msecs)

{
  long lVar1;
  QSslSocketPrivate *this_00;
  QTcpSocket *pQVar2;
  bool bVar3;
  char cVar4;
  SocketState SVar5;
  int iVar6;
  undefined4 uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if ((((this_00->plainSocket != (QTcpSocket *)0x0) && (this_00->connectionEncrypted == false)) &&
      ((this_00->mode != UnencryptedMode || (this_00->autoStartHandshake == true)))) &&
     (bVar3 = QSslSocketPrivate::verifyProtocolSupported(this_00,"QSslSocket::waitForEncrypted:"),
     bVar3)) {
    QElapsedTimer::start();
    SVar5 = QAbstractSocket::state(&this_00->plainSocket->super_QAbstractSocket);
    if (SVar5 == ConnectedState) goto LAB_00251cd2;
    cVar4 = (**(code **)(*(long *)&this_00->plainSocket->super_QAbstractSocket + 0x130))
                      (this_00->plainSocket,msecs);
    while (cVar4 != '\0') {
LAB_00251cd2:
      cVar4 = this_00->connectionEncrypted;
      if ((bool)cVar4 != false) goto LAB_00251d1c;
      if (this_00->mode == UnencryptedMode) {
        startClientEncryption(this);
      }
      pQVar2 = this_00->plainSocket;
      iVar6 = QElapsedTimer::elapsed();
      uVar7 = qt_subtract_from_timeout(msecs,iVar6);
      cVar4 = (**(code **)(*(long *)&pQVar2->super_QAbstractSocket + 0xb8))(pQVar2,uVar7);
    }
  }
  cVar4 = '\0';
LAB_00251d1c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocket::waitForEncrypted(int msecs)
{
    Q_D(QSslSocket);
    if (!d->plainSocket || d->connectionEncrypted)
        return false;
    if (d->mode == UnencryptedMode && !d->autoStartHandshake)
        return false;
    if (!d->verifyProtocolSupported("QSslSocket::waitForEncrypted:"))
        return false;

    QElapsedTimer stopWatch;
    stopWatch.start();

    if (d->plainSocket->state() != QAbstractSocket::ConnectedState) {
        // Wait until we've entered connected state.
        if (!d->plainSocket->waitForConnected(msecs))
            return false;
    }

    while (!d->connectionEncrypted) {
        // Start the handshake, if this hasn't been started yet.
        if (d->mode == UnencryptedMode)
            startClientEncryption();
        // Loop, waiting until the connection has been encrypted or an error
        // occurs.
        if (!d->plainSocket->waitForReadyRead(qt_subtract_from_timeout(msecs, stopWatch.elapsed())))
            return false;
    }
    return d->connectionEncrypted;
}